

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methodarea.cpp
# Opt level: O2

bool __thiscall MethodArea::addClass(MethodArea *this,ClassRuntime *classRuntime)

{
  ClassFile *pCVar1;
  char *pcVar2;
  size_type sVar3;
  mapped_type *ppCVar4;
  allocator local_41;
  key_type local_40;
  
  pCVar1 = ClassRuntime::getClassFile(classRuntime);
  pcVar2 = getFormattedConstant(pCVar1->constant_pool,pCVar1->this_class);
  std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
          ::count(&this->_classes,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (sVar3 == 0) {
    std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
    ppCVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
              ::operator[](&this->_classes,&local_40);
    *ppCVar4 = classRuntime;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return sVar3 == 0;
}

Assistant:

bool MethodArea::addClass(ClassRuntime *classRuntime) {
    ClassFile *classFile = classRuntime->getClassFile();
    
    const char *key = getFormattedConstant(classFile->constant_pool, classFile->this_class);
    
    if (_classes.count(key) > 0) {
        return false;
    }
    
    _classes[key] = classRuntime;
    return true;
}